

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O1

void __thiscall
vkt::pipeline::anon_unknown_0::TimestampTestInstance::TimestampTestInstance
          (TimestampTestInstance *this,Context *context,StageFlagVector *stages,bool inRenderPass)

{
  Move<vk::Handle<(vk::HandleType)24>_> *pMVar1;
  VkQueryPool obj;
  VkCommandPool obj_00;
  VkCommandBuffer_s *pVVar2;
  DeviceInterface *pDVar3;
  VkFence obj_01;
  Move<vk::Handle<(vk::HandleType)6>_> *pMVar4;
  Move<vk::VkCommandBuffer_s_*> *pMVar5;
  deUint32 queueFamilyIndex;
  DeviceInterface *vk;
  VkDevice device;
  InstanceInterface *vk_00;
  VkPhysicalDevice physicalDevice;
  ulong uVar6;
  deUint64 *pdVar7;
  NotSupportedError *this_00;
  ulong uVar8;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> queueProperties;
  VkFenceCreateInfo fenceParams;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  VkCommandPool VStack_a0;
  string local_98;
  Move<vk::Handle<(vk::HandleType)11>_> *local_70;
  Move<vk::Handle<(vk::HandleType)6>_> *local_68;
  Move<vk::VkCommandBuffer_s_*> *local_60;
  Move<vk::Handle<(vk::HandleType)11>_> local_58;
  StageFlagVector *local_38;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__TimestampTestInstance_00d55840
  ;
  local_38 = &this->m_stages;
  std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::vector
            (local_38,stages);
  this->m_inRenderPass = inRenderPass;
  pMVar1 = &this->m_cmdPool;
  local_60 = &this->m_cmdBuffer;
  local_68 = &this->m_fence;
  local_70 = &this->m_queryPool;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)0x0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = (VkDevice)0x0
  ;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal = 0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_queryPool).super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal = 0;
  (this->m_queryPool).super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_queryPool).super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_queryPool).super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  vk_00 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceQueueFamilyProperties
            ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             local_b8,vk_00,physicalDevice);
  pMVar5 = local_60;
  if (((deUint32 *)(local_b8._0_8_ + 8))[(ulong)queueFamilyIndex * 6] != 0) {
    if ((pointer)local_b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_b8._0_8_,(long)local_a8 - local_b8._0_8_);
    }
    local_a8 = (pointer)0x200000000;
    VStack_a0.m_internal = 8;
    local_b8._0_8_ = (pointer)0xb;
    local_b8._8_8_ = (pointer)0x0;
    ::vk::createQueryPool
              (&local_58,vk,device,(VkQueryPoolCreateInfo *)local_b8,(VkAllocationCallbacks *)0x0);
    local_98.field_2._M_allocated_capacity =
         (size_type)local_58.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device;
    local_98.field_2._8_8_ =
         local_58.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator;
    local_98._M_dataplus._M_p =
         (pointer)local_58.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal;
    local_98._M_string_length =
         (size_type)
         local_58.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_deviceIface;
    local_58.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal = 0;
    local_58.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_58.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_58.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    obj.m_internal =
         (local_70->super_RefBase<vk::Handle<(vk::HandleType)11>_>).m_data.object.m_internal;
    if (obj.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)11>_>::operator()
                (&(this->m_queryPool).super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter,
                 obj);
    }
    (local_70->super_RefBase<vk::Handle<(vk::HandleType)11>_>).m_data.deleter.m_device =
         (VkDevice)local_98.field_2._M_allocated_capacity;
    (local_70->super_RefBase<vk::Handle<(vk::HandleType)11>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)local_98.field_2._8_8_;
    (local_70->super_RefBase<vk::Handle<(vk::HandleType)11>_>).m_data.object.m_internal =
         (deUint64)local_98._M_dataplus._M_p;
    (local_70->super_RefBase<vk::Handle<(vk::HandleType)11>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_98._M_string_length;
    if (local_58.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)11>_>::operator()
                (&local_58.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter,
                 (VkQueryPool)
                 local_58.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal);
    }
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)local_b8,vk,device,1,queueFamilyIndex,
               (VkAllocationCallbacks *)0x0);
    local_98.field_2._M_allocated_capacity = (size_type)local_a8;
    local_98.field_2._8_8_ = VStack_a0.m_internal;
    local_98._M_dataplus._M_p = (pointer)local_b8._0_8_;
    local_98._M_string_length = local_b8._8_8_;
    local_b8._0_8_ = (pointer)0x0;
    local_b8._8_8_ = (pointer)0x0;
    local_a8 = (pointer)0x0;
    VStack_a0.m_internal = 0;
    obj_00.m_internal =
         (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal;
    if (obj_00.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                (&(this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
                 obj_00);
    }
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
         (VkDevice)local_98.field_2._M_allocated_capacity;
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)local_98.field_2._8_8_;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal =
         (deUint64)local_98._M_dataplus._M_p;
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_98._M_string_length;
    if (local_b8._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)24>_> *)(local_b8 + 8),
                 (VkCommandPool)local_b8._0_8_);
    }
    ::vk::allocateCommandBuffer
              ((Move<vk::VkCommandBuffer_s_*> *)local_b8,vk,device,
               (VkCommandPool)
               (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal,
               VK_COMMAND_BUFFER_LEVEL_PRIMARY);
    local_98.field_2._M_allocated_capacity._0_4_ = SUB84(local_a8,0);
    local_98.field_2._M_allocated_capacity._4_4_ = local_a8._4_4_;
    local_98.field_2._8_4_ = (undefined4)VStack_a0.m_internal;
    local_98.field_2._12_4_ = VStack_a0.m_internal._4_4_;
    local_98._M_dataplus._M_p = (pointer)local_b8._0_8_;
    local_98._M_string_length = local_b8._8_8_;
    local_b8._0_8_ = (pointer)0x0;
    local_b8._8_8_ = (pointer)0x0;
    local_a8 = (pointer)0x0;
    VStack_a0.m_internal = 0;
    pVVar2 = (pMVar5->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object;
    if (pVVar2 != (VkCommandBuffer_s *)0x0) {
      pDVar3 = (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
               m_deviceIface;
      local_58.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal =
           (deUint64)pVVar2;
      (*pDVar3->_vptr_DeviceInterface[0x48])
                (pDVar3,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                        m_device,
                 (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
                 m_internal,1);
    }
    pMVar4 = local_68;
    *(undefined4 *)&(pMVar5->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_device =
         local_98.field_2._M_allocated_capacity._0_4_;
    *(undefined4 *)
     ((long)&(pMVar5->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_device + 4) =
         local_98.field_2._M_allocated_capacity._4_4_;
    *(undefined4 *)
     &(pMVar5->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_pool.m_internal =
         local_98.field_2._8_4_;
    *(undefined4 *)
     ((long)&(pMVar5->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_pool.m_internal + 4)
         = local_98.field_2._12_4_;
    *(undefined4 *)&(pMVar5->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object =
         local_98._M_dataplus._M_p._0_4_;
    *(undefined4 *)((long)&(pMVar5->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object + 4) =
         local_98._M_dataplus._M_p._4_4_;
    *(undefined4 *)&(pMVar5->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_deviceIface =
         (undefined4)local_98._M_string_length;
    *(undefined4 *)
     ((long)&(pMVar5->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_deviceIface + 4) =
         local_98._M_string_length._4_4_;
    if ((pointer)local_b8._0_8_ != (pointer)0x0) {
      local_98._M_dataplus._M_p = (pointer)local_b8._0_8_;
      (*(*(_func_int ***)local_b8._8_8_)[0x48])(local_b8._8_8_,local_a8,VStack_a0.m_internal,1);
    }
    local_58.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_58.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal = 8;
    local_58.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)local_b8,vk,device,
                      (VkFenceCreateInfo *)&local_58,(VkAllocationCallbacks *)0x0);
    local_98.field_2._M_allocated_capacity = (size_type)local_a8;
    local_98.field_2._8_8_ = VStack_a0.m_internal;
    local_98._M_dataplus._M_p = (pointer)local_b8._0_8_;
    local_98._M_string_length = local_b8._8_8_;
    local_b8._0_8_ = (pointer)0x0;
    local_b8._8_8_ = (pointer)0x0;
    local_a8 = (pointer)0x0;
    VStack_a0.m_internal = 0;
    obj_01.m_internal =
         (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.object.m_internal;
    if (obj_01.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                (&(this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter,
                 obj_01);
    }
    (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.deleter.m_device =
         (VkDevice)local_98.field_2._M_allocated_capacity;
    (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)local_98.field_2._8_8_;
    (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.object.m_internal =
         (deUint64)local_98._M_dataplus._M_p;
    (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_98._M_string_length;
    if (local_b8._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)6>_> *)(local_b8 + 8),(VkFence)local_b8._0_8_);
    }
    uVar6 = (long)(this->m_stages).
                  super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_stages).
                  super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = 0xffffffffffffffff;
    if (uVar6 < 0x7ffffffffffffffd) {
      uVar8 = uVar6 * 2;
    }
    pdVar7 = (deUint64 *)operator_new__(uVar8);
    this->m_timestampValues = pdVar7;
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"Universal queue does not support timestamps","");
  tcu::NotSupportedError::NotSupportedError(this_00,&local_98);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TimestampTestInstance::TimestampTestInstance(Context&                context,
											 const StageFlagVector&  stages,
											 const bool              inRenderPass)
	: TestInstance  (context)
	, m_stages      (stages)
	, m_inRenderPass(inRenderPass)
{
	const DeviceInterface&      vk                  = context.getDeviceInterface();
	const VkDevice              vkDevice            = context.getDevice();
	const deUint32              queueFamilyIndex    = context.getUniversalQueueFamilyIndex();

	// Check support for timestamp queries
	{
		const std::vector<VkQueueFamilyProperties>   queueProperties = vk::getPhysicalDeviceQueueFamilyProperties(m_context.getInstanceInterface(), m_context.getPhysicalDevice());

		DE_ASSERT(queueFamilyIndex < (deUint32)queueProperties.size());

		if (!queueProperties[queueFamilyIndex].timestampValidBits)
			throw tcu::NotSupportedError("Universal queue does not support timestamps");
	}

	// Create Query Pool
	{
		const VkQueryPoolCreateInfo queryPoolParams =
		{
		   VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO,    // VkStructureType               sType;
		   DE_NULL,                                     // const void*                   pNext;
		   0u,                                          // VkQueryPoolCreateFlags        flags;
		   VK_QUERY_TYPE_TIMESTAMP,                     // VkQueryType                   queryType;
		   TimestampTest::ENTRY_COUNT,                  // deUint32                      entryCount;
		   0u,                                          // VkQueryPipelineStatisticFlags pipelineStatistics;
		};

		m_queryPool = createQueryPool(vk, vkDevice, &queryPoolParams);
	}

	// Create command pool
	m_cmdPool = createCommandPool(vk, vkDevice, VK_COMMAND_POOL_CREATE_TRANSIENT_BIT, queueFamilyIndex);

	// Create command buffer
	m_cmdBuffer = allocateCommandBuffer(vk, vkDevice, *m_cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	// Create fence
	{
		const VkFenceCreateInfo fenceParams =
		{
			VK_STRUCTURE_TYPE_FENCE_CREATE_INFO,        // VkStructureType      sType;
			DE_NULL,                                    // const void*          pNext;
			0u,                                         // VkFenceCreateFlags   flags;
		};

		m_fence = createFence(vk, vkDevice, &fenceParams);
	}

	// alloc timestamp values
	m_timestampValues = new deUint64[m_stages.size()];
}